

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void OnPollPreparePfn(stTimeoutItem_t *ap,epoll_event *e,stTimeoutItemLink_t *active)

{
  stPoll_t *ap_00;
  
  *(ushort *)((long)&(ap[1].pPrev)->pPrev + 6) = (ushort)e->events & 0x15d;
  ap_00 = (stPoll_t *)ap[1].pNext;
  ap_00->iRaiseCnt = ap_00->iRaiseCnt + 1;
  if (ap_00->iAllEventDetach != 0) {
    return;
  }
  ap_00->iAllEventDetach = 1;
  RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>((stTimeoutItem_t *)ap_00);
  AddTail<stPoll_t,stTimeoutItemLink_t>(active,ap_00);
  return;
}

Assistant:

void OnPollPreparePfn( stTimeoutItem_t * ap,struct epoll_event &e,stTimeoutItemLink_t *active )
{
	stPollItem_t *lp = (stPollItem_t *)ap;
	lp->pSelf->revents = EpollEvent2Poll( e.events );


	stPoll_t *pPoll = lp->pPoll;
	pPoll->iRaiseCnt++;

	if( !pPoll->iAllEventDetach )
	{
		pPoll->iAllEventDetach = 1;

		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( pPoll );

		AddTail( active,pPoll );

	}
}